

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeAsyncGeneratorPrototype
               (DynamicObject *asyncGeneratorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StaticType *type;
  LiteralString *pLVar5;
  JavascriptFunction *pJVar6;
  
  this = (((asyncGeneratorPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((pSVar1->config).threadConfig)->m_ES2018AsyncIteration == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0xb89,
                                "(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled())"
                                ,
                                "library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  DeferredTypeHandlerBase::Convert(typeHandler,asyncGeneratorPrototype,mode,5,0);
  (*(asyncGeneratorPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncGeneratorPrototype,0x67,
             (this->super_JavascriptLibraryBase).asyncGeneratorFunctionPrototype.ptr,2,0,0,0);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar5 = LiteralString::New(type,L"AsyncGenerator",0xe,this->recycler);
    (*(asyncGeneratorPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (asyncGeneratorPrototype,0x1b,pLVar5,2,0,0,0);
  }
  pJVar6 = EnsureAsyncGeneratorReturnFunction(this);
  (*(asyncGeneratorPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncGeneratorPrototype,0x135,pJVar6,6,0,0,0);
  pJVar6 = EnsureAsyncGeneratorNextFunction(this);
  (*(asyncGeneratorPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncGeneratorPrototype,0x107,pJVar6,6,0,0,0);
  pJVar6 = EnsureAsyncGeneratorThrowFunction(this);
  (*(asyncGeneratorPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncGeneratorPrototype,0x16a,pJVar6,6,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(asyncGeneratorPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAsyncGeneratorPrototype(DynamicObject* asyncGeneratorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = asyncGeneratorPrototype->GetLibrary();
        ScriptContext* scriptContext = library->GetScriptContext();
        Assert(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled());
        typeHandler->Convert(asyncGeneratorPrototype, mode, 5);

        library->AddMember(asyncGeneratorPrototype, PropertyIds::constructor, library->asyncGeneratorFunctionPrototype, PropertyConfigurable);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(asyncGeneratorPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("AsyncGenerator")), PropertyConfigurable);
        }

        library->AddMember(asyncGeneratorPrototype, PropertyIds::return_, library->EnsureAsyncGeneratorReturnFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(asyncGeneratorPrototype, PropertyIds::next, library->EnsureAsyncGeneratorNextFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(asyncGeneratorPrototype, PropertyIds::throw_, library->EnsureAsyncGeneratorThrowFunction(), PropertyBuiltInMethodDefaults);

        asyncGeneratorPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }